

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-IRIS-Training.cpp
# Opt level: O3

int main(void)

{
  double *pdVar1;
  char cVar2;
  result_type rVar3;
  istream *piVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  double *pdVar8;
  ostream *poVar9;
  int iVar10;
  Index col;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  MatrixXd accuracy;
  string line;
  MatrixXd batch_X;
  MatrixXd y;
  MatrixXd X;
  MatrixXd batch_y;
  MatrixXd validate_y;
  MatrixXd validate_X;
  string delimiter;
  default_random_engine generator;
  uniform_int_distribution<int> distribution;
  ANN n;
  ifstream file;
  DenseStorage<double,__1,__1,__1,_0> local_4e8;
  long local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  DenseStorage<double,__1,__1,__1,_0> local_4b8;
  long local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  DenseStorage<double,__1,__1,__1,_0> local_488;
  double local_468;
  undefined8 uStack_460;
  void *local_450;
  long local_448;
  long local_440;
  void *local_438;
  long local_430;
  long local_428;
  DenseStorage<double,__1,__1,__1,_0> local_420;
  DenseStorage<double,__1,__1,__1,_0> local_408;
  DenseStorage<double,__1,__1,__1,_0> local_3e8;
  long *local_3c8 [2];
  long local_3b8 [2];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_3a8;
  param_type local_3a0;
  string local_398;
  string local_378;
  string local_358;
  DenseStorage<double,__1,__1,__1,_0> local_338;
  DenseStorage<double,__1,__1,__1,_0> local_320;
  ANN local_308;
  DenseStorage<double,__1,__1,__1,_0> local_2c8;
  DenseStorage<double,__1,__1,__1,_0> local_2b0;
  DenseStorage<double,__1,__1,__1,_0> local_298;
  DenseStorage<double,__1,__1,__1,_0> local_280;
  DenseStorage<double,__1,__1,__1,_0> local_268;
  DenseStorage<double,__1,__1,__1,_0> local_250;
  long local_238 [65];
  
  ANN::ANN(&local_308);
  ANN::setInputSize(&local_308,4);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"tanh","");
  ANN::addLayer(&local_308,0x32,&local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"tanh","");
  ANN::addLayer(&local_308,0x32,&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"sigmoid","");
  ANN::addLayer(&local_308,3,&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::ifstream(local_238,"/home/haukur/MasterProject/Plotting/iris.csv",_S_in);
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,",","");
  local_4b8.m_data = (double *)0x96;
  local_4b8.m_rows = 4;
  local_4b8.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_438,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4b8);
  local_4b8.m_data = (double *)0x96;
  local_4b8.m_rows = 3;
  local_4b8.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_450,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4b8);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_4b8.m_data = (double *)&local_4b8.m_cols;
    local_4b8.m_rows = 0;
    local_4b8.m_cols = local_4b8.m_cols & 0xffffffffffffff00;
    local_468 = 0.0;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_4b8,cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      lVar5 = std::__cxx11::string::find((char *)&local_4b8,(ulong)local_3c8[0],0);
      if (lVar5 != -1) {
        lVar5 = -1;
        do {
          std::__cxx11::string::substr((ulong)&local_4e8,(ulong)&local_4b8);
          pdVar8 = local_4e8.m_data;
          piVar6 = __errno_location();
          iVar10 = *piVar6;
          *piVar6 = 0;
          dVar15 = strtod((char *)pdVar8,(char **)&local_488);
          if (local_488.m_data == pdVar8) {
            std::__throw_invalid_argument("stod");
LAB_00107411:
            std::__throw_invalid_argument("stod");
LAB_0010741d:
            std::__throw_out_of_range("stod");
LAB_00107429:
            std::__throw_invalid_argument("stod");
LAB_00107435:
            std::__throw_out_of_range("stod");
LAB_00107441:
            std::__throw_out_of_range("stod");
            goto LAB_0010744d;
          }
          if (*piVar6 != 0) {
            if (*piVar6 != 0x22) goto LAB_00106a65;
            goto LAB_0010741d;
          }
          *piVar6 = iVar10;
LAB_00106a65:
          if (local_4e8.m_data != (double *)&local_4e8.m_cols) {
            operator_delete(local_4e8.m_data,(ulong)((long)(double **)local_4e8.m_cols + 1));
          }
          if (lVar5 + 1 != 0) {
            std::__cxx11::string::substr((ulong)&local_4e8,(ulong)&local_4b8);
            pdVar8 = local_4e8.m_data;
            iVar10 = *piVar6;
            *piVar6 = 0;
            dVar15 = strtod((char *)local_4e8.m_data,(char **)&local_488);
            if (local_488.m_data == pdVar8) goto LAB_00107411;
            if (*piVar6 != 0) {
              if (*piVar6 != 0x22) goto LAB_00106b4d;
              goto LAB_00107435;
            }
            *piVar6 = iVar10;
LAB_00106b4d:
            std::__cxx11::string::substr((ulong)&local_488,(ulong)&local_4b8);
            pdVar8 = local_488.m_data;
            iVar10 = *piVar6;
            *piVar6 = 0;
            dVar16 = strtod((char *)local_488.m_data,(char **)&local_420);
            if (local_420.m_data == pdVar8) goto LAB_00107429;
            if (*piVar6 == 0) {
              *piVar6 = iVar10;
LAB_00106ba5:
              if (((lVar5 < 0) || (local_430 <= (long)local_468)) || (local_428 <= lVar5)) {
LAB_001073e6:
                __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0x16d,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                             );
              }
              *(double *)((long)local_438 + (long)local_468 * 8 + local_430 * lVar5 * 8) =
                   dVar15 + dVar16 / 10.0;
              if (local_488.m_data != (double *)&local_488.m_cols) {
                operator_delete(local_488.m_data,local_488.m_cols + 1);
              }
              if (local_4e8.m_data != (double *)&local_4e8.m_cols) {
                operator_delete(local_4e8.m_data,(ulong)((long)(double **)local_4e8.m_cols + 1));
              }
              goto LAB_00106c4c;
            }
            if (*piVar6 != 0x22) goto LAB_00106ba5;
            goto LAB_00107441;
          }
          iVar10 = (int)dVar15;
          if (((iVar10 < 0) || (local_448 <= (long)local_468)) || (local_440 <= iVar10))
          goto LAB_001073e6;
          *(undefined8 *)((long)local_450 + (long)local_468 * 8 + local_448 * iVar10 * 8) =
               0x3ff0000000000000;
LAB_00106c4c:
          std::__cxx11::string::erase((ulong)&local_4b8,0);
          lVar7 = std::__cxx11::string::find((char *)&local_4b8,(ulong)local_3c8[0],0);
          lVar5 = lVar5 + 1;
        } while (lVar7 != -1);
      }
      local_468 = (double)((long)local_468 + 1);
    }
    if (local_4b8.m_data != (double *)&local_4b8.m_cols) {
      operator_delete(local_4b8.m_data,local_4b8.m_cols + 1);
    }
  }
  local_4b8.m_data = (double *)0x14;
  local_4b8.m_rows = 4;
  local_4b8.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_488,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4b8);
  local_4b8.m_data = (double *)0x14;
  local_4b8.m_rows = 3;
  local_4b8.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_420,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_4b8);
  lVar5 = local_430;
  local_3a8._M_x = 1;
  local_3a0._M_a = 0;
  local_3a0._M_b = 0x77;
  if ((0x95 < local_430) && (3 < local_428)) {
    lVar7 = (long)local_438 + 0x3c0;
    local_3e8.m_data = (double *)0x0;
    local_3e8.m_rows = 0;
    local_3e8.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_3e8,0x78,0x1e,4);
    if (((local_3e8.m_rows == 0x1e) && (local_3e8.m_cols == 4)) ||
       ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_3e8,0x78,0x1e,4),
        local_3e8.m_rows == 0x1e && (local_3e8.m_cols == 4)))) {
      lVar14 = local_448;
      lVar11 = 0;
      pdVar8 = local_3e8.m_data;
      do {
        uVar13 = 0xfffffffffffffffe;
        do {
          pdVar1 = (double *)(lVar7 + 0x10 + uVar13 * 8);
          dVar15 = pdVar1[1];
          pdVar8[uVar13 + 2] = *pdVar1;
          (pdVar8 + uVar13 + 2)[1] = dVar15;
          uVar13 = uVar13 + 2;
        } while (uVar13 < 0x1c);
        lVar11 = lVar11 + 1;
        lVar7 = lVar7 + lVar5 * 8;
        pdVar8 = pdVar8 + 0x1e;
      } while (lVar11 != 4);
      if ((local_448 < 0x96) || (local_440 < 3)) {
        pcVar12 = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 30, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 30, BlockCols = 3, InnerPanel = false]"
        ;
        goto LAB_001073dc;
      }
      lVar5 = (long)local_450 + 0x3c0;
      local_408.m_data = (double *)0x0;
      local_408.m_rows = 0;
      local_408.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_408,0x5a,0x1e,3);
      if (((local_408.m_rows == 0x1e) && (local_408.m_cols == 3)) ||
         ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_408,0x5a,0x1e,3),
          local_408.m_rows == 0x1e && (local_408.m_cols == 3)))) {
        lVar7 = 0;
        pdVar8 = local_408.m_data;
        do {
          uVar13 = 0xfffffffffffffffe;
          do {
            pdVar1 = (double *)(lVar5 + 0x10 + uVar13 * 8);
            dVar15 = pdVar1[1];
            pdVar8[uVar13 + 2] = *pdVar1;
            (pdVar8 + uVar13 + 2)[1] = dVar15;
            uVar13 = uVar13 + 2;
          } while (uVar13 < 0x1c);
          lVar7 = lVar7 + 1;
          lVar5 = lVar5 + lVar14 * 8;
          pdVar8 = pdVar8 + 0x1e;
        } while (lVar7 != 3);
        local_468 = 0.1;
        uStack_460 = 0;
        iVar10 = 0;
        do {
          lVar7 = 0;
          lVar5 = 0;
          do {
            rVar3 = std::uniform_int_distribution<int>::operator()
                              ((uniform_int_distribution<int> *)&local_3a0,&local_3a8,&local_3a0);
            lVar14 = (long)rVar3;
            local_4b8.m_data = (double *)((long)local_438 + lVar14 * 8);
            local_4b8.m_cols = (Index)&local_438;
            local_498 = 0;
            local_490 = 1;
            local_4a0 = lVar14;
            if (((rVar3 < 0) || (local_430 <= lVar14)) || (local_428 < 4)) {
LAB_001073b0:
              pcVar12 = 
              "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1, 4>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = 4, InnerPanel = false]"
              ;
              goto LAB_001073dc;
            }
            local_4e8.m_data = (double *)((long)local_488.m_data + lVar7);
            local_4e8.m_cols = (Index)&local_488;
            local_4c8 = 0;
            local_4c0 = 1;
            local_4d0 = lVar5;
            if ((local_488.m_rows <= lVar5) || (local_488.m_cols < 4)) goto LAB_001073b0;
            Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>,_1>::
            operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_1>
                       *)&local_4e8,
                      (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_1>
                       *)&local_4b8);
            local_4b8.m_data = (double *)(lVar14 * 8 + (long)local_450);
            local_4b8.m_cols = (Index)&local_450;
            local_498 = 0;
            local_490 = 1;
            if ((local_448 <= lVar14) || (local_440 < 3)) {
LAB_001073c7:
              pcVar12 = 
              "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
              ;
              local_4a0 = lVar14;
              goto LAB_001073dc;
            }
            local_4e8.m_data = (double *)((long)local_420.m_data + lVar7);
            local_4e8.m_cols = (Index)&local_420;
            local_4c8 = 0;
            local_4c0 = 1;
            local_4d0 = lVar5;
            if ((local_420.m_rows <= lVar5) || (local_420.m_cols < 3)) goto LAB_001073c7;
            local_4a0 = lVar14;
            Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>,_1>::
            operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>,_1>
                       *)&local_4e8,
                      (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false>,_1>
                       *)&local_4b8);
            lVar5 = lVar5 + 1;
            lVar7 = lVar7 + 8;
          } while (lVar5 != 0x14);
          ANN::setLearningRate(&local_308,local_468);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_250,&local_488);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_268,&local_420);
          ANN::fit(&local_308,(MatrixXd *)&local_250,(MatrixXd *)&local_268);
          free(local_268.m_data);
          free(local_250.m_data);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_280,&local_3e8);
          ANN::predict((MatrixXd *)&local_4b8,&local_308,(MatrixXd *)&local_280);
          free(local_280.m_data);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_298,&local_488);
          ANN::predict((MatrixXd *)&local_4e8,&local_308,(MatrixXd *)&local_298);
          free(local_298.m_data);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_320,&local_4e8);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_2b0,&local_420);
          dVar15 = comparePrediction((MatrixXd *)&local_320,(MatrixXd *)&local_2b0);
          poVar9 = std::ostream::_M_insert<double>(dVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_338,&local_4b8);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_2c8,&local_408);
          dVar15 = comparePrediction((MatrixXd *)&local_338,(MatrixXd *)&local_2c8);
          poVar9 = std::ostream::_M_insert<double>(dVar15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          free(local_2c8.m_data);
          free(local_338.m_data);
          free(local_2b0.m_data);
          free(local_320.m_data);
          free(local_4e8.m_data);
          free(local_4b8.m_data);
          local_468 = (double)(~-(ulong)(0.01 < local_468) & (ulong)local_468 |
                              (ulong)(local_468 * 0.99) & -(ulong)(0.01 < local_468));
          iVar10 = iVar10 + 1;
          if (iVar10 == 1000) {
            free(local_408.m_data);
            free(local_3e8.m_data);
            free(local_420.m_data);
            free(local_488.m_data);
            free(local_450);
            free(local_438);
            if (local_3c8[0] != local_3b8) {
              operator_delete(local_3c8[0],local_3b8[0] + 1);
            }
            std::ifstream::~ifstream(local_238);
            ANN::~ANN(&local_308);
            return 0;
          }
        } while( true );
      }
      pcVar12 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, 30, 3>, T1 = double, T2 = double]"
      ;
    }
    else {
      pcVar12 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, 30, 4>, T1 = double, T2 = double]"
      ;
    }
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2d1,pcVar12);
  }
LAB_0010744d:
  pcVar12 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>, 30, 4>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 30, BlockCols = 4, InnerPanel = false]"
  ;
LAB_001073dc:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Block.h"
                ,0x85,pcVar12);
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setInputSize(4);
    n.addLayer(50, "tanh");
    n.addLayer(50, "tanh");
    n.addLayer(3, "sigmoid");

    ifstream file("/home/haukur/MasterProject/Plotting/iris.csv");
    string delimiter = ",";

    Eigen::MatrixXd X = Eigen::MatrixXd::Zero(150, 4);
    Eigen::MatrixXd y = Eigen::MatrixXd::Zero(150, 3);

    if(file.is_open()) {
        string line;
        int line_index = 0;
        while(getline(file, line)) {
            size_t pos = 0;
            int token;
            int index = -1;
            while ((pos = line.find(delimiter)) != std::string::npos) {
                token = stod(line.substr(0, pos));
                if(index == -1) {
                    y(line_index, token) = 1;
                }
                else {
                    X(line_index, index) = stod(line.substr(0, 1)) + stod(line.substr(2, 1))/10;
                }
                line.erase(0, pos + delimiter.length());
                index++;
            }
            line_index++;
        }
    }

    int batch_size = 20;

    Eigen::MatrixXd batch_X = Eigen::MatrixXd::Zero(batch_size, 4);
    Eigen::MatrixXd batch_y = Eigen::MatrixXd::Zero(batch_size, 3);

    std::default_random_engine generator;
    std::uniform_int_distribution<int> distribution(0,119);
    
    double learning_rate = 0.1;

    Eigen::MatrixXd validate_X = X.block<30,4>(120,0);
    Eigen::MatrixXd validate_y = y.block<30,3>(120,0);

    for(int i = 0; i < 1000; i++) {
        for(int i = 0; i < batch_size; i++) {
            int pick = distribution(generator);
            batch_X.block<1,4>(i, 0) = X.block<1,4>(pick, 0);
            batch_y.block<1,3>(i,0) = y.block<1,3>(pick, 0);
        }
        n.setLearningRate(learning_rate);
        n.fit(batch_X, batch_y);
        if(i % 1 == 0) {
            Eigen::MatrixXd prediction = n.predict(validate_X);
            Eigen::MatrixXd accuracy = n.predict(batch_X);
            cout << i << "," << comparePrediction(accuracy, batch_y) << "," << comparePrediction(prediction, validate_y) << endl;
            // Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            // cout << "Epoch: " << i << " MSE: " << se.mean() << " learning rate: " << learning_rate << endl;
        }
        if(learning_rate > 0.01)
            learning_rate *= 0.99;
    }
    
    return 0;
}